

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

int __thiscall Imf_3_4::TiledOutputFile::levelHeight(TiledOutputFile *this,int ly)

{
  int iVar1;
  undefined8 in_RDI;
  stringstream _iex_replace_s;
  BaseExc *e;
  LevelRoundingMode in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  
  iVar1 = levelSize((int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffe3c,
                    in_stack_fffffffffffffe38);
  return iVar1;
}

Assistant:

int
TiledOutputFile::levelHeight (int ly) const
{
    try
    {
        return levelSize (
            _data->minY, _data->maxY, ly, _data->tileDesc.roundingMode);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error calling levelHeight() on image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}